

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesPathWidget.cxx
# Opt level: O0

void __thiscall
cmCursesPathWidget::cmCursesPathWidget
          (cmCursesPathWidget *this,int width,int height,int left,int top)

{
  bool bVar1;
  int top_local;
  int left_local;
  int height_local;
  int width_local;
  cmCursesPathWidget *this_local;
  
  cmCursesStringWidget::cmCursesStringWidget
            (&this->super_cmCursesStringWidget,width,height,left,top);
  (this->super_cmCursesStringWidget).super_cmCursesWidget._vptr_cmCursesWidget =
       (_func_int **)&PTR__cmCursesPathWidget_01494118;
  std::__cxx11::string::string((string *)&this->LastString);
  std::__cxx11::string::string((string *)&this->LastGlob);
  (this->super_cmCursesStringWidget).super_cmCursesWidget.Type = PATH;
  this->Cycle = false;
  this->CurrentIndex = 0;
  bVar1 = cmCursesColor::HasColors();
  if (bVar1) {
    set_field_fore((this->super_cmCursesStringWidget).super_cmCursesWidget.Field,0x400);
    set_field_back((this->super_cmCursesStringWidget).super_cmCursesWidget.Field,0x400);
  }
  else {
    set_field_fore((this->super_cmCursesStringWidget).super_cmCursesWidget.Field,0);
    set_field_back((this->super_cmCursesStringWidget).super_cmCursesWidget.Field,0x10000);
  }
  return;
}

Assistant:

cmCursesPathWidget::cmCursesPathWidget(int width, int height, int left,
                                       int top)
  : cmCursesStringWidget(width, height, left, top)
{
  this->Type = cmStateEnums::PATH;
  this->Cycle = false;
  this->CurrentIndex = 0;
  if (cmCursesColor::HasColors()) {
    set_field_fore(this->Field, COLOR_PAIR(cmCursesColor::Path));
    set_field_back(this->Field, COLOR_PAIR(cmCursesColor::Path));
  } else {
    set_field_fore(this->Field, A_NORMAL);
    set_field_back(this->Field, A_STANDOUT);
  }
}